

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentTypeImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMDocumentTypeImpl::DOMDocumentTypeImpl
          (DOMDocumentTypeImpl *this,DOMDocument *ownerDoc,XMLCh *qualifiedName,XMLCh *pubId,
          XMLCh *sysId,bool heap)

{
  MemoryManager *pMVar1;
  DOMDocument *doc_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  DOMException *pDVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLSize_t XVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  XMLCh *pXVar7;
  DOMNamedNodeMapImpl *pDVar8;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  DOMDocumentImpl *local_460;
  DOMNode *local_448;
  DOMNode *local_430;
  DOMDocumentImpl *local_3e8;
  XMLMutex *local_3c8;
  MemoryManager *local_3b8;
  DOMDocumentImpl *local_3a8;
  long local_398;
  MemoryManager *local_388;
  MemoryManager *local_370;
  DOMDocumentImpl *local_360;
  long local_350;
  MemoryManager *local_340;
  DOMDocumentImpl *local_328;
  DOMDocumentImpl *local_310;
  MemoryManager *local_2e8;
  DOMDocumentImpl *local_2d8;
  long local_2c8;
  MemoryManager *local_2b8;
  DOMNode *local_280;
  DOMDocument *doc;
  XMLMutexLock lock;
  DOMDocumentImpl *docImpl;
  XMLCh temp [256];
  DOMDocumentImpl **local_50;
  XMLCh *newName;
  int index;
  bool heap_local;
  XMLCh *sysId_local;
  XMLCh *pubId_local;
  XMLCh *qualifiedName_local;
  DOMDocument *ownerDoc_local;
  DOMDocumentTypeImpl *this_local;
  
  DOMDocumentType::DOMDocumentType(&this->super_DOMDocumentType);
  HasDOMNodeImpl::HasDOMNodeImpl(&this->super_HasDOMNodeImpl);
  HasDOMParentImpl::HasDOMParentImpl(&this->super_HasDOMParentImpl);
  HasDOMChildImpl::HasDOMChildImpl(&this->super_HasDOMChildImpl);
  (this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode =
       (_func_int **)&PTR__DOMDocumentTypeImpl_005299a8;
  (this->super_HasDOMNodeImpl)._vptr_HasDOMNodeImpl =
       (_func_int **)&PTR__DOMDocumentTypeImpl_00529b88;
  (this->super_HasDOMParentImpl)._vptr_HasDOMParentImpl =
       (_func_int **)&PTR__DOMDocumentTypeImpl_00529bb8;
  (this->super_HasDOMChildImpl)._vptr_HasDOMChildImpl =
       (_func_int **)&PTR__DOMDocumentTypeImpl_00529be8;
  local_280 = (DOMNode *)0x0;
  if (ownerDoc != (DOMDocument *)0x0) {
    local_280 = &ownerDoc->super_DOMNode;
  }
  DOMNodeImpl::DOMNodeImpl(&this->fNode,(DOMNode *)this,local_280);
  DOMParentNode::DOMParentNode(&this->fParent,(DOMNode *)this,ownerDoc);
  DOMChildNode::DOMChildNode(&this->fChild);
  this->fName = (XMLCh *)0x0;
  this->fEntities = (DOMNamedNodeMapImpl *)0x0;
  this->fNotations = (DOMNamedNodeMapImpl *)0x0;
  this->fElements = (DOMNamedNodeMapImpl *)0x0;
  this->fPublicId = (XMLCh *)0x0;
  this->fSystemId = (XMLCh *)0x0;
  this->fInternalSubset = (XMLCh *)0x0;
  this->fIntSubsetReading = false;
  this->fIsCreatedFromHeap = heap;
  iVar3 = DOMDocumentImpl::indexofQualifiedName(qualifiedName);
  pMVar1 = XMLPlatformUtils::fgMemoryManager;
  if (iVar3 < 0) {
    pDVar5 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this == (DOMDocumentTypeImpl *)0x0) {
      local_2b8 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar3 = (*(this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var,iVar3) == 0) {
        local_2c8 = 0;
      }
      else {
        local_2c8 = CONCAT44(extraout_var,iVar3) + -8;
      }
      if (local_2c8 == 0) {
        local_2e8 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar3 = (*(this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_00,iVar3) == 0) {
          local_2d8 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_2d8 = (DOMDocumentImpl *)(CONCAT44(extraout_var_00,iVar3) + -8);
        }
        local_2e8 = DOMDocumentImpl::getMemoryManager(local_2d8);
      }
      local_2b8 = local_2e8;
    }
    DOMException::DOMException(pDVar5,0xe,0,local_2b8);
    __cxa_throw(pDVar5,&DOMException::typeinfo,DOMException::~DOMException);
  }
  if (0 < iVar3) {
    if (iVar3 < 0xff) {
      local_50 = &docImpl;
    }
    else {
      XVar6 = XMLString::stringLen(qualifiedName);
      iVar4 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,XVar6 * 2 + 2);
      local_50 = (DOMDocumentImpl **)CONCAT44(extraout_var_01,iVar4);
    }
    XMLString::copyNString((XMLCh *)local_50,qualifiedName,(long)iVar3);
    *(undefined2 *)((long)local_50 + (long)iVar3 * 2) = 0;
    if (ownerDoc == (DOMDocument *)0x0) {
      bVar2 = XMLChar1_0::isValidName((XMLCh *)local_50);
      if ((!bVar2) || (bVar2 = XMLChar1_0::isValidName(qualifiedName + (long)iVar3 + 1), !bVar2)) {
        pDVar5 = (DOMException *)__cxa_allocate_exception(0x28);
        if (this == (DOMDocumentTypeImpl *)0x0) {
          local_388 = XMLPlatformUtils::fgMemoryManager;
        }
        else {
          iVar3 = (*(this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0xc])();
          if (CONCAT44(extraout_var_04,iVar3) == 0) {
            local_398 = 0;
          }
          else {
            local_398 = CONCAT44(extraout_var_04,iVar3) + -8;
          }
          if (local_398 == 0) {
            local_3b8 = XMLPlatformUtils::fgMemoryManager;
          }
          else {
            iVar3 = (*(this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0xc])();
            if (CONCAT44(extraout_var_05,iVar3) == 0) {
              local_3a8 = (DOMDocumentImpl *)0x0;
            }
            else {
              local_3a8 = (DOMDocumentImpl *)(CONCAT44(extraout_var_05,iVar3) + -8);
            }
            local_3b8 = DOMDocumentImpl::getMemoryManager(local_3a8);
          }
          local_388 = local_3b8;
        }
        DOMException::DOMException(pDVar5,0xe,0,local_388);
        __cxa_throw(pDVar5,&DOMException::typeinfo,DOMException::~DOMException);
      }
    }
    else {
      if (ownerDoc == (DOMDocument *)0x0) {
        local_310 = (DOMDocumentImpl *)0x0;
      }
      else {
        local_310 = (DOMDocumentImpl *)&ownerDoc[-1].super_DOMNode;
      }
      bVar2 = DOMDocumentImpl::isXMLName(local_310,(XMLCh *)local_50);
      if (!bVar2) {
LAB_002f1401:
        pDVar5 = (DOMException *)__cxa_allocate_exception(0x28);
        if (this == (DOMDocumentTypeImpl *)0x0) {
          local_340 = XMLPlatformUtils::fgMemoryManager;
        }
        else {
          iVar3 = (*(this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0xc])();
          if (CONCAT44(extraout_var_02,iVar3) == 0) {
            local_350 = 0;
          }
          else {
            local_350 = CONCAT44(extraout_var_02,iVar3) + -8;
          }
          if (local_350 == 0) {
            local_370 = XMLPlatformUtils::fgMemoryManager;
          }
          else {
            iVar3 = (*(this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0xc])();
            if (CONCAT44(extraout_var_03,iVar3) == 0) {
              local_360 = (DOMDocumentImpl *)0x0;
            }
            else {
              local_360 = (DOMDocumentImpl *)(CONCAT44(extraout_var_03,iVar3) + -8);
            }
            local_370 = DOMDocumentImpl::getMemoryManager(local_360);
          }
          local_340 = local_370;
        }
        DOMException::DOMException(pDVar5,0xe,0,local_340);
        __cxa_throw(pDVar5,&DOMException::typeinfo,DOMException::~DOMException);
      }
      if (ownerDoc == (DOMDocument *)0x0) {
        local_328 = (DOMDocumentImpl *)0x0;
      }
      else {
        local_328 = (DOMDocumentImpl *)&ownerDoc[-1].super_DOMNode;
      }
      bVar2 = DOMDocumentImpl::isXMLName(local_328,qualifiedName + (long)iVar3 + 1);
      if (!bVar2) goto LAB_002f1401;
    }
    if (0xfe < iVar3) {
      (*XMLPlatformUtils::fgMemoryManager->_vptr_MemoryManager[4])
                (XMLPlatformUtils::fgMemoryManager,local_50);
    }
  }
  if (ownerDoc == (DOMDocument *)0x0) {
    XMLMutexLock::XMLMutexLock((XMLMutexLock *)&doc,sDocumentMutex);
    doc_00 = sDocument;
    if (sDocument == (DOMDocument *)0x0) {
      local_430 = (DOMNode *)0x0;
    }
    else {
      local_430 = &sDocument[-1].super_DOMNode;
    }
    iVar3 = (*local_430->_vptr_DOMNode[7])(local_430,pubId);
    this->fPublicId = (XMLCh *)CONCAT44(extraout_var_07,iVar3);
    if (doc_00 == (DOMDocument *)0x0) {
      local_448 = (DOMNode *)0x0;
    }
    else {
      local_448 = &doc_00[-1].super_DOMNode;
    }
    iVar3 = (*local_448->_vptr_DOMNode[7])(local_448,sysId);
    this->fSystemId = (XMLCh *)CONCAT44(extraout_var_08,iVar3);
    if (doc_00 == (DOMDocument *)0x0) {
      local_460 = (DOMDocumentImpl *)0x0;
    }
    else {
      local_460 = (DOMDocumentImpl *)&doc_00[-1].super_DOMNode;
    }
    pXVar7 = DOMDocumentImpl::getPooledString(local_460,qualifiedName);
    this->fName = pXVar7;
    pDVar8 = (DOMNamedNodeMapImpl *)operator_new(0x618,doc_00);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar8,(DOMNode *)this);
    this->fEntities = pDVar8;
    pDVar8 = (DOMNamedNodeMapImpl *)operator_new(0x618,doc_00);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar8,(DOMNode *)this);
    this->fNotations = pDVar8;
    pDVar8 = (DOMNamedNodeMapImpl *)operator_new(0x618,doc_00);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar8,(DOMNode *)this);
    this->fElements = pDVar8;
    XMLMutexLock::~XMLMutexLock((XMLMutexLock *)&doc);
  }
  else {
    if (ownerDoc == (DOMDocument *)0x0) {
      local_3c8 = (XMLMutex *)0x0;
    }
    else {
      local_3c8 = (XMLMutex *)&ownerDoc[-1].super_DOMNode;
    }
    lock.fToLock = local_3c8;
    iVar3 = (**(_func_int **)((long)local_3c8->fHandle + 0x38))(local_3c8,pubId);
    this->fPublicId = (XMLCh *)CONCAT44(extraout_var_06,iVar3);
    pXVar7 = (XMLCh *)(**(code **)((long)(lock.fToLock)->fHandle + 0x38))(lock.fToLock,sysId);
    this->fSystemId = pXVar7;
    if (ownerDoc == (DOMDocument *)0x0) {
      local_3e8 = (DOMDocumentImpl *)0x0;
    }
    else {
      local_3e8 = (DOMDocumentImpl *)&ownerDoc[-1].super_DOMNode;
    }
    pXVar7 = DOMDocumentImpl::getPooledString(local_3e8,qualifiedName);
    this->fName = pXVar7;
    pDVar8 = (DOMNamedNodeMapImpl *)operator_new(0x618,ownerDoc);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar8,(DOMNode *)this);
    this->fEntities = pDVar8;
    pDVar8 = (DOMNamedNodeMapImpl *)operator_new(0x618,ownerDoc);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar8,(DOMNode *)this);
    this->fNotations = pDVar8;
    pDVar8 = (DOMNamedNodeMapImpl *)operator_new(0x618,ownerDoc);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar8,(DOMNode *)this);
    this->fElements = pDVar8;
  }
  return;
}

Assistant:

DOMDocumentTypeImpl::DOMDocumentTypeImpl(DOMDocument *ownerDoc,
                                   const XMLCh *qualifiedName,
                                   const XMLCh *pubId,
                                   const XMLCh *sysId,
                                   bool heap)
    : fNode(this, ownerDoc),
    fParent(this, ownerDoc),
    fName(0),
    fEntities(0),
    fNotations(0),
    fElements(0),
    fPublicId(0),
    fSystemId(0),
    fInternalSubset(0),
    fIntSubsetReading(false),
    fIsCreatedFromHeap(heap)
{
    int index = DOMDocumentImpl::indexofQualifiedName(qualifiedName);
    if (index < 0)
        throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
    else if (index > 0)
    {
        // we have to make sure the qualifiedName has correct prefix and localName
        // although we don't really to store them separately
        XMLCh* newName;
        XMLCh temp[256];
        if (index >= 255)
            newName = (XMLCh*) XMLPlatformUtils::fgMemoryManager->allocate
            (
                (XMLString::stringLen(qualifiedName)+1) * sizeof(XMLCh)
            );//new XMLCh[XMLString::stringLen(qualifiedName)+1];
        else
            newName = temp;

        XMLString::copyNString(newName, qualifiedName, index);
        newName[index] = chNull;

        // Before we carry on, we should check if the prefix or localName are valid XMLName
        if (ownerDoc) {
            if (!((DOMDocumentImpl*)ownerDoc)->isXMLName(newName) || !((DOMDocumentImpl*)ownerDoc)->isXMLName(qualifiedName+index+1))
                throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
        }
        else {
            // document is not there yet, so assume XML 1.0
            if (!XMLChar1_0::isValidName(newName) || !XMLChar1_0::isValidName(qualifiedName+index+1))
                throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
        }

        if (index >= 255)
            XMLPlatformUtils::fgMemoryManager->deallocate(newName);//delete[] newName;
    }

    if (ownerDoc)
    {
        DOMDocumentImpl *docImpl = (DOMDocumentImpl *)ownerDoc;
        fPublicId = docImpl->cloneString(pubId);
        fSystemId = docImpl->cloneString(sysId);
        fName = ((DOMDocumentImpl *)ownerDoc)->getPooledString(qualifiedName);
        fEntities = new (ownerDoc) DOMNamedNodeMapImpl(this);
        fNotations= new (ownerDoc) DOMNamedNodeMapImpl(this);
        fElements = new (ownerDoc) DOMNamedNodeMapImpl(this);
    }
    else
    {
        XMLMutexLock lock(sDocumentMutex);
        DOMDocument* doc = sDocument;
        fPublicId = ((DOMDocumentImpl*) doc)->cloneString(pubId);
        fSystemId = ((DOMDocumentImpl*) doc)->cloneString(sysId);
        fName = ((DOMDocumentImpl*) doc)->getPooledString(qualifiedName);
        fEntities = new (doc) DOMNamedNodeMapImpl(this);
        fNotations= new (doc) DOMNamedNodeMapImpl(this);
        fElements = new (doc) DOMNamedNodeMapImpl(this);
    }
}